

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall HighsSymmetryDetection::removeFixPoints(HighsSymmetryDetection *this)

{
  anon_class_8_1_8991fb9c __pred;
  anon_class_8_1_8991fb9c __pred_00;
  __normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
  __last;
  const_iterator __last_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_01;
  anon_class_16_2_53381f59_for__M_pred __pred_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last_02;
  difference_type dVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar3;
  size_type sVar4;
  difference_type dVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  HighsInt vertex;
  HighsInt i_2;
  HighsInt cellNumber;
  HighsInt cellStart;
  HighsInt j;
  HighsInt i_1;
  HighsInt unitCellIndex;
  HighsInt i;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  value_type vVar6;
  undefined4 in_stack_fffffffffffffee8;
  int iVar7;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef8;
  value_type in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff04;
  __normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
  in_stack_ffffffffffffff08;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  undefined4 in_stack_ffffffffffffff10;
  value_type in_stack_ffffffffffffff14;
  undefined8 in_stack_ffffffffffffff20;
  HighsSymmetryDetection *in_stack_ffffffffffffff28;
  int local_b0;
  value_type local_ac;
  int local_a8;
  int local_a0;
  int local_9c;
  int local_c;
  
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  for (local_c = 0; local_c < in_RDI._M_current[0xab]; local_c = local_c + 1) {
    std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::begin
              ((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffed8);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 2),(long)local_c);
    __gnu_cxx::
    __normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
    ::operator+((__normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::begin
              ((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffed8);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 2),(long)(local_c + 1));
    __gnu_cxx::
    __normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
    ::operator+((__normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
    __last._M_current._4_4_ = in_stack_ffffffffffffff04;
    __last._M_current._0_4_ = in_stack_ffffffffffffff00;
    __pred.this._4_4_ = in_stack_fffffffffffffefc;
    __pred.this._0_4_ = in_stack_fffffffffffffef8;
    std::
    partition<__gnu_cxx::__normal_iterator<std::pair<int,unsigned_int>*,std::vector<std::pair<int,unsigned_int>,std::allocator<std::pair<int,unsigned_int>>>>,HighsSymmetryDetection::removeFixPoints()::__0>
              (in_stack_ffffffffffffff08,__last,__pred);
    std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>::begin
              ((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                *)in_stack_fffffffffffffed8);
    dVar1 = __gnu_cxx::operator-
                      ((__normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       (__normal_iterator<std::pair<int,_unsigned_int>_*,_std::vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>_>
                        *)in_stack_fffffffffffffed8);
    in_stack_ffffffffffffff14 = (value_type)dVar1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8),(long)local_c);
    *pvVar2 = in_stack_ffffffffffffff14;
  }
  __first._M_current = in_RDI._M_current + 0x1a;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
  __last_02._M_current._4_4_ = in_stack_ffffffffffffff14;
  __last_02._M_current._0_4_ = in_stack_ffffffffffffff10;
  __pred_01.this._4_4_ = in_stack_ffffffffffffff04;
  __pred_01.this._0_4_ = in_stack_ffffffffffffff00;
  __pred_01.unitCellIndex = __first._M_current;
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::removeFixPoints()::__1>
            (in_RDI,__last_02,__pred_01);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffed8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffed8);
  __last_00._M_current._4_4_ = in_stack_ffffffffffffff04;
  __last_00._M_current._0_4_ = in_stack_ffffffffffffff00;
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             (const_iterator)__first._M_current,__last_00);
  for (local_9c = 0; local_9c < in_RDI._M_current[0xab]; local_9c = local_9c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8),(long)local_9c)
    ;
    in_stack_ffffffffffffff04 = *pvVar2;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 2),
                        (long)(local_9c + 1));
    if (in_stack_ffffffffffffff04 != *pvVar2) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8),
                          (long)local_9c);
      local_a0 = *pvVar2;
      while (in_stack_ffffffffffffff00 = local_a0,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 2),
                                (long)(local_9c + 1)), in_stack_ffffffffffffff00 < *pvVar2) {
        this_00 = (vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x26);
        pvVar3 = std::
                 vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                 ::operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                               *)(in_RDI._M_current + 0xe),(long)local_a0);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)pvVar3->first);
        in_stack_fffffffffffffefc = *pvVar2;
        pvVar3 = std::
                 vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                 ::operator[]((vector<std::pair<int,_unsigned_int>,_std::allocator<std::pair<int,_unsigned_int>_>_>
                               *)(in_RDI._M_current + 0xe),(long)local_a0);
        pvVar3->first = in_stack_fffffffffffffefc;
        local_a0 = local_a0 + 1;
      }
    }
  }
  sVar4 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x1a));
  if ((int)sVar4 < in_RDI._M_current[0xab]) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x1a));
    in_RDI._M_current[0xab] = (int)sVar4;
    if (in_RDI._M_current[0xab] == 0) {
      in_RDI._M_current[0xac] = 0;
    }
    else {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::assign
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                 (size_type)in_stack_fffffffffffffed8,(value_type_conflict5 *)0x6c2c72);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x6c2c83);
      local_a8 = 0;
      local_ac = 0;
      for (local_b0 = 0; local_b0 < in_RDI._M_current[0xab]; local_b0 = local_b0 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x1a),
                            (long)local_b0);
        iVar7 = *pvVar2;
        vVar6 = local_ac;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x26),
                            (long)iVar7);
        if (vVar6 != *pvVar2) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x26),
                              (long)iVar7);
          local_ac = *pvVar2;
          iVar7 = local_b0;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x20),
                              (long)local_a8);
          *pvVar2 = iVar7;
          local_a8 = local_b0;
        }
        updateCellMembership
                  (in_stack_ffffffffffffff28,(HighsInt)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                   (HighsInt)in_stack_ffffffffffffff20,SUB81((ulong)in_RDI._M_current >> 0x38,0));
      }
      vVar6 = in_RDI._M_current[0xab];
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 0x20),
                          (long)local_a8);
      *pvVar2 = vVar6;
      std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
      std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffed8);
      __last_01._M_current._4_4_ = in_stack_ffffffffffffff04;
      __last_01._M_current._0_4_ = in_stack_ffffffffffffff00;
      __pred_00.this._4_4_ = in_stack_fffffffffffffefc;
      __pred_00.this._0_4_ = in_stack_fffffffffffffef8;
      std::
      partition_point<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::removeFixPoints()::__2>
                (__first,__last_01,__pred_00);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffed8);
      dVar5 = __gnu_cxx::operator-
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(vVar6,in_stack_fffffffffffffee0),
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffffed8);
      in_RDI._M_current[0xac] = (int)dVar5;
    }
  }
  else {
    in_RDI._M_current[0xac] = in_RDI._M_current[0xa9];
  }
  return;
}

Assistant:

void HighsSymmetryDetection::removeFixPoints() {
  Gend.resize(numVertices);
  for (HighsInt i = 0; i < numVertices; ++i) {
    Gend[i] =
        std::partition(Gedge.begin() + Gstart[i], Gedge.begin() + Gstart[i + 1],
                       [&](const std::pair<HighsInt, HighsUInt>& edge) {
                         return cellSize(vertexToCell[edge.first]) > 1;
                       }) -
        Gedge.begin();
    assert(Gend[i] >= Gstart[i] && Gend[i] <= Gstart[i + 1]);
  }

  HighsInt unitCellIndex = numVertices;
  currentPartition.erase(
      std::remove_if(currentPartition.begin(), currentPartition.end(),
                     [&](HighsInt vertex) {
                       if (cellSize(vertexToCell[vertex]) == 1) {
                         --unitCellIndex;
                         vertexToCell[vertex] = unitCellIndex;
                         return true;
                       }
                       return false;
                     }),
      currentPartition.end());

  for (HighsInt i = 0; i < numVertices; ++i) {
    if (Gend[i] == Gstart[i + 1]) continue;

    for (HighsInt j = Gend[i]; j < Gstart[i + 1]; ++j)
      Gedge[j].first = vertexToCell[Gedge[j].first];
  }

  if ((HighsInt)currentPartition.size() < numVertices) {
    numVertices = currentPartition.size();
    if (numVertices == 0) {
      numActiveCols = 0;
      return;
    }
    currentPartitionLinks.resize(numVertices);
    cellInRefinementQueue.assign(numVertices, false);
    assert(refinementQueue.empty());
    refinementQueue.clear();
    HighsInt cellStart = 0;
    HighsInt cellNumber = 0;
    for (HighsInt i = 0; i < numVertices; ++i) {
      HighsInt vertex = currentPartition[i];
      // if the cell number is different to the current cell number this is the
      // start of a new cell
      if (cellNumber != vertexToCell[vertex]) {
        // remember the number of this cell to identify its end
        cellNumber = vertexToCell[vertex];
        // set the link of the cell start to point to its end
        currentPartitionLinks[cellStart] = i;
        // remember start of this cell
        cellStart = i;
      }

      // correct the vertexToCell array to store the start index of the
      // cell, not its number
      updateCellMembership(i, cellStart, false);
    }

    // set the column partition link of the last started cell to point past the
    // end
    assert((int)currentPartitionLinks.size() > 0);
    currentPartitionLinks[cellStart] = numVertices;

    numActiveCols =
        std::partition_point(currentPartition.begin(), currentPartition.end(),
                             [&](HighsInt v) { return v < numCol; }) -
        currentPartition.begin();
  } else
    numActiveCols = numCol;
}